

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall
QDataWidgetMapperPrivate::dataChanged
          (QDataWidgetMapperPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight,
          QList<int> *param_4)

{
  bool bVar1;
  QModelIndex *in_RCX;
  WidgetMapper *in_RDX;
  QDataWidgetMapperPrivate *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  WidgetMapper *e;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  __normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
  *in_stack_ffffffffffffff78;
  QModelIndex *in_stack_ffffffffffffff90;
  QModelIndex *bottomRight_00;
  QPersistentModelIndex local_48 [3];
  WidgetMapper *local_30;
  __normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
  local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QModelIndex::parent(in_stack_ffffffffffffff90);
  bVar1 = ::operator!=(in_RDI,(QPersistentModelIndex *)in_stack_ffffffffffffff78);
  if (!bVar1) {
    bottomRight_00 = (QModelIndex *)&in_RDI[6].m;
    local_28[0]._M_current = (WidgetMapper *)&DAT_aaaaaaaaaaaaaaaa;
    local_28[0]._M_current =
         (WidgetMapper *)
         std::
         vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
         ::begin((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
                  *)in_RDI);
    local_30 = (WidgetMapper *)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = (WidgetMapper *)
               std::
               vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
               ::end((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
                      *)in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
                               *)in_RDI,in_stack_ffffffffffffff78), bVar1) {
      __gnu_cxx::
      __normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
      ::operator*(local_28);
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_48);
      bVar1 = qContainsIndex((QModelIndex *)in_RDX,in_RCX,bottomRight_00);
      if (bVar1) {
        populate(in_RSI,in_RDX);
      }
      __gnu_cxx::
      __normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
      ::operator++(local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDataWidgetMapperPrivate::dataChanged(const QModelIndex &topLeft,
                                           const QModelIndex &bottomRight, const QList<int> &)
{
    if (topLeft.parent() != rootIndex)
        return; // not in our hierarchy

    for (WidgetMapper &e : widgetMap) {
        if (qContainsIndex(e.currentIndex, topLeft, bottomRight))
            populate(e);
    }
}